

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::parser::ChaiScript_Parser::buildInt
          (ChaiScript_Parser *this,int base,string *t_val,bool prefixed)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type sVar7;
  size_type sVar8;
  bool bVar9;
  Boxed_Value BVar10;
  string val;
  
  pcVar1 = (t_val->_M_dataplus)._M_p;
  bVar3 = false;
  bVar2 = false;
  sVar7 = t_val->_M_string_length;
  bVar5 = false;
  while (bVar9 = bVar5, sVar8 = sVar7 - 1, sVar7 != 0) {
    lVar4 = sVar7 - 1;
    sVar7 = sVar8;
    bVar5 = true;
    if ((pcVar1[lVar4] & 0xdfU) != 0x55) {
      if ((pcVar1[lVar4] & 0xdfU) != 0x4c) break;
      if (bVar2) {
        bVar3 = true;
      }
      bVar2 = true;
      bVar5 = bVar9;
    }
  }
  if (prefixed) {
    val._M_dataplus._M_p = (pointer)&val.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&val,pcVar1 + 2,pcVar1 + t_val->_M_string_length);
  }
  else {
    std::__cxx11::string::string((string *)&val,(string *)t_val);
  }
  uVar6 = std::__cxx11::stoll(&val,(size_t *)0x0,base);
  if (bVar9) {
    if ((bool)(uVar6 >> 0x20 != 0 | bVar2)) {
      if (bVar3) {
        detail::const_var_impl<unsigned_long_long>((unsigned_long_long *)this);
      }
      else {
        detail::const_var_impl<unsigned_long>((unsigned_long *)this);
      }
      goto LAB_0018a6c1;
    }
  }
  else {
    if ((long)(int)uVar6 == uVar6 && !bVar2) {
      detail::const_var_impl<int>((int *)this);
      goto LAB_0018a6c1;
    }
    if ((base == 10) || (uVar6 >> 0x20 != 0 || bVar2)) {
      if (bVar3) {
        detail::const_var_impl<long_long>((longlong *)this);
      }
      else {
        detail::const_var_impl<long>((long *)this);
      }
      goto LAB_0018a6c1;
    }
  }
  detail::const_var_impl<unsigned_int>((uint *)this);
LAB_0018a6c1:
  std::__cxx11::string::~string((string *)&val);
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, const std::string &t_val, const bool prefixed)
      {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i)
        {
          const char val = t_val[i-1];

          if (val == 'u' || val == 'U')
          {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_)
            {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        const auto val = prefixed?std::string(t_val.begin()+2,t_val.end()):t_val;

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#endif

#endif

        try {
          auto u = std::stoll(val,nullptr,base);


          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min() && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            auto u = std::stoull(val,nullptr,base);

            if (u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif

      }